

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void __thiscall ACSStringPool::MarkStringMap(ACSStringPool *this,FWorldGlobalArray *aray)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  Node *pNVar4;
  PoolEntry *pPVar5;
  ulong uVar6;
  uint uVar7;
  Node *pNVar8;
  
  uVar2 = aray->Size;
  if ((ulong)uVar2 != 0) {
    pNVar4 = aray->Nodes;
    uVar3 = (this->Pool).Count;
    pPVar5 = (this->Pool).Array;
    uVar6 = 0;
    do {
      uVar6 = uVar6 & 0xffffffff;
      pNVar8 = pNVar4 + uVar6;
      while (pNVar8->Next == (Node *)0x1) {
        uVar6 = uVar6 + 1;
        pNVar8 = pNVar8 + 1;
        if (uVar2 <= uVar6) {
          return;
        }
      }
      uVar7 = (pNVar8->Pair).Value;
      if (((uVar7 & 0xfff00000) == 0x7ff00000) && (uVar7 = uVar7 & 0xfffff, uVar7 < uVar3)) {
        pbVar1 = (byte *)((long)&pPVar5[uVar7].LockCount + 3);
        *pbVar1 = *pbVar1 | 0x80;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)uVar6 < uVar2);
  }
  return;
}

Assistant:

void ACSStringPool::MarkStringMap(const FWorldGlobalArray &aray)
{
	FWorldGlobalArray::ConstIterator it(aray);
	FWorldGlobalArray::ConstPair *pair;

	while (it.NextPair(pair))
	{
		int num = pair->Value;
		if ((num & LIBRARYID_MASK) == STRPOOL_LIBRARYID_OR)
		{
			num &= ~LIBRARYID_MASK;
			if ((unsigned)num < Pool.Size())
			{
				Pool[num].LockCount |= 0x80000000;
			}
		}
	}
}